

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O3

bool __thiscall
cmCursesOptionsWidget::HandleInput
          (cmCursesOptionsWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  int iVar3;
  size_type sVar4;
  
  iVar3 = *key;
  if (iVar3 < 0x104) {
    if (iVar3 == 2) {
LAB_00224691:
      if (w == (WINDOW *)0x0) {
        iVar3 = -1;
      }
      else {
        iVar3 = w->_maxy + 1;
      }
      wtouchln(w,0,iVar3,1);
      wrefresh(w);
      pp_Var1 = (this->super_cmCursesWidget)._vptr_cmCursesWidget;
      pbVar2 = (this->Options).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = (long)(this->Options).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      if (this->CurrentOption != 0) {
        sVar4 = this->CurrentOption;
      }
      this->CurrentOption = sVar4 - 1;
      (*pp_Var1[4])(this,pbVar2 + (sVar4 - 1));
      return true;
    }
    if ((iVar3 != 6) && (iVar3 != 10)) {
      return false;
    }
  }
  else {
    if (iVar3 == 0x104) goto LAB_00224691;
    if ((iVar3 != 0x105) && (iVar3 != 0x157)) {
      return false;
    }
  }
  NextOption(this);
  if (w == (WINDOW *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = w->_maxy + 1;
  }
  wtouchln(w,0,iVar3,1);
  wrefresh(w);
  return true;
}

Assistant:

bool cmCursesOptionsWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else if (key == KEY_LEFT || key == ctrl('b'))
    {
    touchwin(w);
    wrefresh(w);
    this->PreviousOption();
    return true;
    }
  else if (key == KEY_RIGHT || key == ctrl('f'))
    {
    this->NextOption();
    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }
}